

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valve.cpp
# Opt level: O0

void __thiscall Valve::convertUnits(Valve *this,Network *nw)

{
  double dVar1;
  __type_conflict _Var2;
  double extraout_XMM0_Qa;
  double local_20;
  double c;
  Network *nw_local;
  Valve *this_local;
  
  dVar1 = Network::ucf(nw,DIAMETER);
  (this->super_Link).diameter = (this->super_Link).diameter / dVar1;
  local_20 = (this->super_Link).lossCoeff;
  if (local_20 < 0.1) {
    local_20 = 0.1;
  }
  _Var2 = std::pow<double,int>((this->super_Link).diameter,4);
  this->lossFactor = (local_20 * 0.02517) / _Var2;
  (*(this->super_Link).super_Element._vptr_Element[5])((this->super_Link).initSetting,this,nw);
  (this->super_Link).initSetting = extraout_XMM0_Qa;
  return;
}

Assistant:

void Valve::convertUnits(Network* nw)
{
    // ... convert diameter units
    diameter /= nw->ucf(Units::DIAMETER);

    // ... apply a minimum minor loss coeff. if necessary
    double c = lossCoeff;
    if ( c < MIN_LOSS_COEFF ) c = MIN_LOSS_COEFF;

    // ... convert minor loss from V^2/2g basis to Q^2 basis
    lossFactor = 0.02517 * c / pow(diameter, 4);

    // ... convert initial valve setting units
    initSetting = convertSetting(nw, initSetting);
}